

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_options.cpp
# Opt level: O0

bool __thiscall
Potassco::ProgramOptions::Value::parse(Value *this,string *name,string *value,State st)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  State in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  Value *in_RDI;
  char *x;
  Value *in_stack_ffffffffffffff78;
  allocator local_51;
  string local_50 [32];
  char *local_30;
  State local_24;
  undefined8 local_20;
  undefined8 local_18;
  byte local_1;
  
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  uVar3 = std::__cxx11::string::empty();
  if (((uVar3 & 1) == 0) || (bVar1 = isImplicit((Value *)0x129307), !bVar1)) {
    iVar2 = (*in_RDI->_vptr_Value[2])(in_RDI,local_18,local_20);
    local_1 = state(in_RDI,(bool)((byte)iVar2 & 1),local_24);
  }
  else {
    pcVar4 = implicit(in_stack_ffffffffffffff78);
    local_30 = pcVar4;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,pcVar4,&local_51);
    iVar2 = (*in_RDI->_vptr_Value[2])(in_RDI,local_18,local_50);
    local_1 = state(in_RDI,(bool)((byte)iVar2 & 1),local_24);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool Value::parse(const std::string& name, const std::string& value, State st) {
	if (!value.empty() || !isImplicit()) return state(doParse(name, value), st);
	const char* x = implicit();
	assert(x);
	return state(doParse(name, x), st);
}